

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_impl.cc
# Opt level: O2

void __thiscall
QuickImpl::ProcessBye(QuickImpl *this,string *ip,uint16_t port,uint8_t *data,int16_t data_len)

{
  long lVar1;
  iterator __it;
  key_type *__k;
  Location local_48;
  
  __k = (key_type *)(data + 1);
  __it = std::
         _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
         ::find(&(this->_connections)._M_h,__k);
  if (__it.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    local_48._function_name = "ProcessBye";
    local_48._file_name =
         "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/quick/quick_impl.cc"
    ;
    local_48._line_number = 0x114;
    LogWrapper::Write(&g_quic_log,&local_48,2,anon_var_dwarf_72398,(ulong)*__k);
  }
  else {
    local_48._function_name = "ProcessBye";
    local_48._file_name =
         "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/quick/quick_impl.cc"
    ;
    local_48._line_number = 0x118;
    LogWrapper::Write(&g_quic_log,&local_48,2,anon_var_dwarf_723af,(ulong)*__k,
                      (ip->_M_dataplus)._M_p,(uint)port);
    lVar1 = *(long *)((long)__it.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>,_false>
                            ._M_cur + 0x10);
    *(undefined1 *)(lVar1 + 0x5c) = 0;
    *(undefined1 *)(lVar1 + 0x80160) = 0;
    if (this->_as_server == true) {
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::erase(&(this->_connections)._M_h,
              (const_iterator)
              __it.
              super__Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>,_false>
              ._M_cur);
    }
    (**(code **)(*(long *)this->_quick_cb + 0x18))(this->_quick_cb,*__k);
  }
  return;
}

Assistant:

void QuickImpl::ProcessBye(const std::string &ip, uint16_t port, const uint8_t* data, int16_t data_len)
{
	QuickBye* bye = (QuickBye*)data;
	auto iter = _connections.find(bye->session_id);
	if (iter == _connections.end()) {
		g_quic_log.Write(RTC_FROM_HERE, LOG_LEVEL_INFO, "�Ҳ�����Ӧ��session id %u, �޷������� byte ��Ϣ", bye->session_id);
		return;
	}

	g_quic_log.Write(RTC_FROM_HERE, LOG_LEVEL_INFO, "�����ѶϿ���session id = %u, ip = %s, port = %d", bye->session_id, ip.c_str(), port);
	iter->second->SetServerState(false);
	iter->second->SetAllowReconnect(false);
	if (_as_server)
		_connections.erase(iter);
	_quick_cb->OnDisconnected(bye->session_id);
}